

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getProceduralBlockKind(TokenKind kind)

{
  TokenKind kind_local;
  undefined4 local_4;
  
  if (kind == AlwaysKeyword) {
    local_4 = AlwaysBlock;
  }
  else if (kind == AlwaysCombKeyword) {
    local_4 = AlwaysCombBlock;
  }
  else if (kind == AlwaysFFKeyword) {
    local_4 = AlwaysFFBlock;
  }
  else if (kind == AlwaysLatchKeyword) {
    local_4 = AlwaysLatchBlock;
  }
  else if (kind == FinalKeyword) {
    local_4 = FinalBlock;
  }
  else if (kind == InitialKeyword) {
    local_4 = InitialBlock;
  }
  else {
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

SyntaxKind SyntaxFacts::getProceduralBlockKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::InitialKeyword: return SyntaxKind::InitialBlock;
        case TokenKind::FinalKeyword: return SyntaxKind::FinalBlock;
        case TokenKind::AlwaysKeyword: return SyntaxKind::AlwaysBlock;
        case TokenKind::AlwaysCombKeyword: return SyntaxKind::AlwaysCombBlock;
        case TokenKind::AlwaysFFKeyword: return SyntaxKind::AlwaysFFBlock;
        case TokenKind::AlwaysLatchKeyword: return SyntaxKind::AlwaysLatchBlock;
        default: return SyntaxKind::Unknown;
    }
}